

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_rgb.c
# Opt level: O3

void yuv420_rgb24_std(uint32_t width,uint32_t height,uint8_t *Y,uint8_t *U,uint8_t *V,
                     uint32_t Y_stride,uint32_t UV_stride,uint8_t *RGB,uint32_t RGB_stride,
                     YCbCrType yuv_type)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  uint8_t *puVar19;
  int iVar20;
  uint uVar21;
  uint local_84;
  uint local_7c;
  
  if (height != 1) {
    uVar11 = (ulong)yuv_type;
    iVar8 = Y_stride * 2;
    iVar9 = RGB_stride * 2;
    uVar21 = 0;
    local_7c = 0;
    local_84 = 0;
    do {
      if (width != 1) {
        uVar15 = (ulong)((local_84 >> 1) * UV_stride);
        bVar1 = YUV2RGB[uVar11].cb_factor;
        bVar2 = YUV2RGB[uVar11].cr_factor;
        bVar3 = YUV2RGB[uVar11].g_cb_factor;
        bVar4 = YUV2RGB[uVar11].g_cr_factor;
        uVar12 = (uint)YUV2RGB[uVar11].y_factor;
        bVar5 = YUV2RGB[uVar11].y_offset;
        lVar16 = 0;
        puVar19 = RGB;
        do {
          uVar6 = V[uVar15];
          iVar14 = (int)(((uint)Y[lVar16 + (ulong)local_7c] - (uint)bVar5) * uVar12) >> 7;
          iVar17 = (int)((uint)bVar2 * ((int)(char)uVar6 ^ 0xffffff80U)) >> 6;
          iVar10 = iVar14 + iVar17;
          if (0xfe < iVar14 + iVar17) {
            iVar10 = 0xff;
          }
          if ((short)iVar10 < 1) {
            iVar10 = 0;
          }
          uVar7 = U[uVar15];
          puVar19[uVar21] = (uint8_t)iVar10;
          iVar10 = (int)(((int)(char)uVar6 ^ 0xffffff80U) * (uint)bVar4 +
                        (uint)bVar3 * ((int)(char)uVar7 ^ 0xffffff80U)) >> 7;
          iVar20 = iVar14 - iVar10;
          if (0xfe < iVar20) {
            iVar20 = 0xff;
          }
          if ((short)iVar20 < 1) {
            iVar20 = 0;
          }
          puVar19[(ulong)uVar21 + 1] = (uint8_t)iVar20;
          iVar13 = (int)(((int)(char)uVar7 ^ 0xffffff80U) * (uint)bVar1) >> 6;
          iVar20 = iVar14 + iVar13;
          if (0xfe < iVar14 + iVar13) {
            iVar20 = 0xff;
          }
          if ((short)iVar20 < 1) {
            iVar20 = 0;
          }
          puVar19[(ulong)uVar21 + 2] = (uint8_t)iVar20;
          iVar20 = (int)(((uint)Y[lVar16 + (ulong)local_7c + 1] - (uint)bVar5) * uVar12) >> 7;
          iVar14 = iVar20 + iVar17;
          if (0xfe < iVar20 + iVar17) {
            iVar14 = 0xff;
          }
          if ((short)iVar14 < 1) {
            iVar14 = 0;
          }
          puVar19[(ulong)uVar21 + 3] = (uint8_t)iVar14;
          iVar14 = iVar20 - iVar10;
          if (0xfe < iVar14) {
            iVar14 = 0xff;
          }
          if ((short)iVar14 < 1) {
            iVar14 = 0;
          }
          puVar19[(ulong)uVar21 + 4] = (uint8_t)iVar14;
          iVar18 = 0xff;
          iVar14 = iVar20 + iVar13;
          if (0xfe < iVar20 + iVar13) {
            iVar14 = iVar18;
          }
          if ((short)iVar14 < 1) {
            iVar14 = 0;
          }
          puVar19[(ulong)uVar21 + 5] = (uint8_t)iVar14;
          iVar20 = (int)(((uint)Y[lVar16 + (ulong)Y_stride] - (uint)bVar5) * uVar12) >> 7;
          iVar14 = iVar20 + iVar17;
          if (0xfe < iVar20 + iVar17) {
            iVar14 = iVar18;
          }
          if ((short)iVar14 < 1) {
            iVar14 = 0;
          }
          puVar19[RGB_stride] = (uint8_t)iVar14;
          iVar14 = iVar20 - iVar10;
          if (0xfe < iVar14) {
            iVar14 = 0xff;
          }
          if ((short)iVar14 < 1) {
            iVar14 = 0;
          }
          puVar19[(ulong)RGB_stride + 1] = (uint8_t)iVar14;
          iVar14 = iVar20 + iVar13;
          if (0xfe < iVar20 + iVar13) {
            iVar14 = iVar18;
          }
          if ((short)iVar14 < 1) {
            iVar14 = 0;
          }
          puVar19[(ulong)RGB_stride + 2] = (uint8_t)iVar14;
          iVar20 = (int)(((uint)Y[lVar16 + (ulong)Y_stride + 1] - (uint)bVar5) * uVar12) >> 7;
          iVar14 = iVar17 + iVar20;
          if (0xfe < iVar17 + iVar20) {
            iVar14 = iVar18;
          }
          if ((short)iVar14 < 1) {
            iVar14 = 0;
          }
          puVar19[(ulong)RGB_stride + 3] = (uint8_t)iVar14;
          iVar10 = iVar20 - iVar10;
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          if ((short)iVar10 < 1) {
            iVar10 = 0;
          }
          puVar19[(ulong)RGB_stride + 4] = (uint8_t)iVar10;
          iVar10 = iVar20 + iVar13;
          if (0xfe < iVar20 + iVar13) {
            iVar10 = 0xff;
          }
          if ((short)iVar10 < 1) {
            iVar10 = 0;
          }
          puVar19[(ulong)RGB_stride + 5] = (uint8_t)iVar10;
          lVar16 = lVar16 + 2;
          uVar15 = uVar15 + 1;
          puVar19 = puVar19 + 6;
        } while ((uint)lVar16 < width - 1);
      }
      local_84 = local_84 + 2;
      local_7c = local_7c + iVar8;
      Y_stride = Y_stride + iVar8;
      RGB_stride = RGB_stride + iVar9;
      uVar21 = uVar21 + iVar9;
    } while (local_84 < height - 1);
  }
  return;
}

Assistant:

void yuv420_rgb24_std(
	uint32_t width, uint32_t height, 
	const uint8_t *Y, const uint8_t *U, const uint8_t *V, uint32_t Y_stride, uint32_t UV_stride, 
	uint8_t *RGB, uint32_t RGB_stride, 
	YCbCrType yuv_type)
{
	const YUV2RGBParam *const param = &(YUV2RGB[yuv_type]);
	uint32_t x, y;
	for(y=0; y<(height-1); y+=2)
	{
		const uint8_t *y_ptr1=Y+y*Y_stride,
			*y_ptr2=Y+(y+1)*Y_stride,
			*u_ptr=U+(y/2)*UV_stride,
			*v_ptr=V+(y/2)*UV_stride;
		
		uint8_t *rgb_ptr1=RGB+y*RGB_stride,
			*rgb_ptr2=RGB+(y+1)*RGB_stride;
		
		for(x=0; x<(width-1); x+=2)
		{
			int8_t u_tmp, v_tmp;
			u_tmp = u_ptr[0]-128;
			v_tmp = v_ptr[0]-128;
			
			//compute Cb Cr color offsets, common to four pixels
			int16_t b_cb_offset, r_cr_offset, g_cbcr_offset;
			b_cb_offset = (param->cb_factor*u_tmp)>>6;
			r_cr_offset = (param->cr_factor*v_tmp)>>6;
			g_cbcr_offset = (param->g_cb_factor*u_tmp + param->g_cr_factor*v_tmp)>>7;
			
			int16_t y_tmp;
			y_tmp = (param->y_factor*(y_ptr1[0]-param->y_offset))>>7;
			rgb_ptr1[0] = clamp(y_tmp + r_cr_offset);
			rgb_ptr1[1] = clamp(y_tmp - g_cbcr_offset);
			rgb_ptr1[2] = clamp(y_tmp + b_cb_offset);
			
			y_tmp = (param->y_factor*(y_ptr1[1]-param->y_offset))>>7;
			rgb_ptr1[3] = clamp(y_tmp + r_cr_offset);
			rgb_ptr1[4] = clamp(y_tmp - g_cbcr_offset);
			rgb_ptr1[5] = clamp(y_tmp + b_cb_offset);
			
			y_tmp = (param->y_factor*(y_ptr2[0]-param->y_offset))>>7;
			rgb_ptr2[0] = clamp(y_tmp + r_cr_offset);
			rgb_ptr2[1] = clamp(y_tmp - g_cbcr_offset);
			rgb_ptr2[2] = clamp(y_tmp + b_cb_offset);
			
			y_tmp = (param->y_factor*(y_ptr2[1]-param->y_offset))>>7;
			rgb_ptr2[3] = clamp(y_tmp + r_cr_offset);
			rgb_ptr2[4] = clamp(y_tmp - g_cbcr_offset);
			rgb_ptr2[5] = clamp(y_tmp + b_cb_offset);
			
			rgb_ptr1 += 6;
			rgb_ptr2 += 6;
			y_ptr1 += 2;
			y_ptr2 += 2;
			u_ptr += 1;
			v_ptr += 1;
		}
	}
}